

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey-ssh1.c
# Opt level: O0

ssh_cipher * des3_pubkey_cipher(void *vkey)

{
  ssh_cipher *c_00;
  undefined1 local_40 [8];
  uint8_t iv [8];
  uint8_t keys3 [24];
  ssh_cipher *c;
  void *vkey_local;
  
  c_00 = ssh_cipher_new(&ssh_3des_ssh1);
  iv = *vkey;
  ssh_cipher_setkey(c_00,iv);
  smemclr(iv,0x18);
  memset(local_40,0,8);
  ssh_cipher_setiv(c_00,local_40);
  return c_00;
}

Assistant:

static ssh_cipher *des3_pubkey_cipher(const void *vkey)
{
    ssh_cipher *c = ssh_cipher_new(&ssh_3des_ssh1);
    uint8_t keys3[24], iv[8];

    memcpy(keys3, vkey, 16);
    memcpy(keys3 + 16, vkey, 8);
    ssh_cipher_setkey(c, keys3);
    smemclr(keys3, sizeof(keys3));

    memset(iv, 0, 8);
    ssh_cipher_setiv(c, iv);

    return c;
}